

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

size_t __thiscall
phmap::priv::
raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
::_find_key<std::__cxx11::string>
          (raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>
           *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,
          size_t hashval)

{
  char *pcVar1;
  ulong uVar2;
  uint uVar3;
  ushort uVar4;
  bool bVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  __m128i match;
  long local_98;
  EqualElement<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  pair<std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_std::tuple<const_phmap::priv::Tracked<int>_&>_>
  local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  uVar2 = *(ulong *)(this + 0x18);
  if ((uVar2 + 1 & uVar2) != 0) {
    __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
  }
  uVar8 = hashval >> 7;
  auVar9 = ZEXT216(CONCAT11((char)hashval,(char)hashval) & 0x7f7f);
  auVar9 = pshuflw(auVar9,auVar9,0);
  local_48._0_4_ = auVar9._0_4_;
  local_48._4_4_ = local_48._0_4_;
  local_48._8_4_ = local_48._0_4_;
  local_48._12_4_ = local_48._0_4_;
  local_98 = 0;
  do {
    uVar8 = uVar8 & uVar2;
    pcVar1 = (char *)(*(long *)this + uVar8);
    local_58 = *pcVar1;
    cStack_57 = pcVar1[1];
    cStack_56 = pcVar1[2];
    cStack_55 = pcVar1[3];
    cStack_54 = pcVar1[4];
    cStack_53 = pcVar1[5];
    cStack_52 = pcVar1[6];
    cStack_51 = pcVar1[7];
    cStack_50 = pcVar1[8];
    cStack_4f = pcVar1[9];
    cStack_4e = pcVar1[10];
    cStack_4d = pcVar1[0xb];
    cStack_4c = pcVar1[0xc];
    cStack_4b = pcVar1[0xd];
    cStack_4a = pcVar1[0xe];
    cStack_49 = pcVar1[0xf];
    auVar9[0] = -(local_48[0] == local_58);
    auVar9[1] = -(local_48[1] == cStack_57);
    auVar9[2] = -(local_48[2] == cStack_56);
    auVar9[3] = -(local_48[3] == cStack_55);
    auVar9[4] = -(local_48[4] == cStack_54);
    auVar9[5] = -(local_48[5] == cStack_53);
    auVar9[6] = -(local_48[6] == cStack_52);
    auVar9[7] = -(local_48[7] == cStack_51);
    auVar9[8] = -(local_48[8] == cStack_50);
    auVar9[9] = -(local_48[9] == cStack_4f);
    auVar9[10] = -(local_48[10] == cStack_4e);
    auVar9[0xb] = -(local_48[0xb] == cStack_4d);
    auVar9[0xc] = -(local_48[0xc] == cStack_4c);
    auVar9[0xd] = -(local_48[0xd] == cStack_4b);
    auVar9[0xe] = -(local_48[0xe] == cStack_4a);
    auVar9[0xf] = -(local_48[0xf] == cStack_49);
    uVar4 = (ushort)(SUB161(auVar9 >> 7,0) & 1) | (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
            (ushort)(SUB161(auVar9 >> 0x17,0) & 1) << 2 |
            (ushort)(SUB161(auVar9 >> 0x1f,0) & 1) << 3 |
            (ushort)(SUB161(auVar9 >> 0x27,0) & 1) << 4 |
            (ushort)(SUB161(auVar9 >> 0x2f,0) & 1) << 5 |
            (ushort)(SUB161(auVar9 >> 0x37,0) & 1) << 6 |
            (ushort)(SUB161(auVar9 >> 0x3f,0) & 1) << 7 |
            (ushort)(SUB161(auVar9 >> 0x47,0) & 1) << 8 |
            (ushort)(SUB161(auVar9 >> 0x4f,0) & 1) << 9 |
            (ushort)(SUB161(auVar9 >> 0x57,0) & 1) << 10 |
            (ushort)(SUB161(auVar9 >> 0x5f,0) & 1) << 0xb |
            (ushort)(SUB161(auVar9 >> 0x67,0) & 1) << 0xc |
            (ushort)(SUB161(auVar9 >> 0x6f,0) & 1) << 0xd |
            (ushort)(SUB161(auVar9 >> 0x77,0) & 1) << 0xe | (ushort)(auVar9[0xf] >> 7) << 0xf;
    if (uVar4 != 0) {
      uVar6 = (uint)uVar4;
      do {
        uVar3 = 0;
        if (uVar6 != 0) {
          for (; (uVar6 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        uVar7 = uVar3 + uVar8 & uVar2;
        local_68.first.
        super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
        .
        super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
        ._M_head_impl =
             (_Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
              )((_Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                 *)(*(long *)(this + 8) + uVar7 * 8))->_M_head_impl;
        local_68.second.super__Tuple_impl<0UL,_const_phmap::priv::Tracked<int>_&>.
        super__Head_base<0UL,_const_phmap::priv::Tracked<int>_&,_false>._M_head_impl =
             (_Tuple_impl<0UL,_const_phmap::priv::Tracked<int>_&>)
             ((long)local_68.first.
                    super__Tuple_impl<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>
                    .
                    super__Head_base<0UL,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_false>
                    ._M_head_impl + 0x20);
        local_78.rhs = key;
        local_78.eq = (key_equal *)(this + 0x28);
        bVar5 = memory_internal::
                DecomposePairImpl<phmap::priv::raw_hash_set<phmap::priv::NodeHashMapPolicy<std::__cxx11::string,phmap::priv::Tracked<int>>,phmap::priv::StringHashEqT<char>::Hash,phmap::priv::StringHashEqT<char>::Eq,std::allocator<std::pair<std::__cxx11::string_const,phmap::priv::Tracked<int>>>>::EqualElement<std::__cxx11::string>,std::__cxx11::string_const&,std::tuple<phmap::priv::Tracked<int>const&>>
                          (&local_78,&local_68);
        if (bVar5) {
          return uVar7;
        }
        uVar6 = uVar6 - 1 & uVar6;
      } while (uVar6 != 0);
    }
    auVar10[0] = -(local_58 == -0x80);
    auVar10[1] = -(cStack_57 == -0x80);
    auVar10[2] = -(cStack_56 == -0x80);
    auVar10[3] = -(cStack_55 == -0x80);
    auVar10[4] = -(cStack_54 == -0x80);
    auVar10[5] = -(cStack_53 == -0x80);
    auVar10[6] = -(cStack_52 == -0x80);
    auVar10[7] = -(cStack_51 == -0x80);
    auVar10[8] = -(cStack_50 == -0x80);
    auVar10[9] = -(cStack_4f == -0x80);
    auVar10[10] = -(cStack_4e == -0x80);
    auVar10[0xb] = -(cStack_4d == -0x80);
    auVar10[0xc] = -(cStack_4c == -0x80);
    auVar10[0xd] = -(cStack_4b == -0x80);
    auVar10[0xe] = -(cStack_4a == -0x80);
    auVar10[0xf] = -(cStack_49 == -0x80);
    if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar10 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar10 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cStack_49 == -0x80) {
      return 0xffffffffffffffff;
    }
    uVar8 = uVar8 + local_98 + 0x10;
    local_98 = local_98 + 0x10;
  } while( true );
}

Assistant:

probe_seq<Group::kWidth> probe(size_t hashval) const {
        return probe_seq<Group::kWidth>(H1(hashval, ctrl_), capacity_);
    }